

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_94284::CheckTypeConflict
          (anon_unknown_dwarf_94284 *this,ExpressionContext *ctx,SynBase *source,InplaceStr name)

{
  uint nameHash;
  IdentifierLookupResult *pIVar1;
  NamespaceData *pNVar2;
  char *pcVar3;
  InplaceStr name_00;
  InplaceStr local_20;
  
  pcVar3 = name.begin;
  local_20.begin = (char *)source;
  local_20.end = pcVar3;
  nameHash = InplaceStr::hash(&local_20);
  pIVar1 = LookupObjectByName((ExpressionContext *)this,nameHash);
  if (((pIVar1 != (IdentifierLookupResult *)0x0) && (pIVar1->variable != (VariableData *)0x0)) &&
     (pIVar1->variable->scope == *(ScopeData **)(this + 0x8158))) {
    pcVar3 = (char *)(ulong)(uint)((int)local_20.end - (int)local_20.begin);
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a variable in current scope");
  }
  name_00.end = pcVar3;
  name_00.begin = local_20.end;
  pNVar2 = FindNamespaceInCurrentScope(this,(ExpressionContext *)local_20.begin,name_00);
  if (pNVar2 != (NamespaceData *)0x0) {
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a namespace",
           (ulong)(uint)((int)local_20.end - (int)local_20.begin));
  }
  return;
}

Assistant:

void CheckTypeConflict(ExpressionContext &ctx, SynBase *source, InplaceStr name)
	{
		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name));
		}

		if(FindNamespaceInCurrentScope(ctx, name))
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a namespace", FMT_ISTR(name));
	}